

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::ClassId(TPZGeoElRefLess<pzgeom::TPZGeoCube> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_88;
  TPZGeoCube local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_88);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_68.super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable._vptr_TPZSavable
       = (TPZSavable)&PTR__TPZGeoCube_018a52f0;
  iVar3 = pzgeom::TPZGeoCube::ClassId(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}